

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall luna::Closure::Accept(Closure *this,GCObjectVisitor *v)

{
  pointer ppUVar1;
  int iVar2;
  Upvalue **upvalue;
  pointer ppUVar3;
  
  iVar2 = (*v->_vptr_GCObjectVisitor[2])(v,this);
  if ((char)iVar2 != '\0') {
    (*(this->prototype_->super_GCObject)._vptr_GCObject[2])(this->prototype_,v);
    ppUVar1 = (this->upvalues_).
              super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppUVar3 = (this->upvalues_).
                   super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppUVar3 != ppUVar1; ppUVar3 = ppUVar3 + 1) {
      (*((*ppUVar3)->super_GCObject)._vptr_GCObject[2])(*ppUVar3,v);
    }
  }
  return;
}

Assistant:

void Closure::Accept(GCObjectVisitor *v)
    {
        if (v->Visit(this))
        {
            prototype_->Accept(v);

            for (const auto &upvalue : upvalues_)
                upvalue->Accept(v);
        }
    }